

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainchan.c
# Opt level: O3

void mainchan_try_fallback_command(mainchan *mc)

{
  SshChannel *pSVar1;
  _Bool _Var2;
  char *pcVar3;
  
  pcVar3 = conf_get_str(mc->conf,0x15);
  _Var2 = conf_get_bool(mc->conf,0x31);
  pSVar1 = mc->sc;
  if (_Var2) {
    (*pSVar1->vt->start_subsystem)(pSVar1,true,pcVar3);
  }
  else {
    (*pSVar1->vt->start_command)(pSVar1,true,pcVar3);
  }
  mc->req_cmd_fallback = true;
  return;
}

Assistant:

static void mainchan_try_fallback_command(mainchan *mc)
{
    const char *cmd = conf_get_str(mc->conf, CONF_remote_cmd2);
    if (conf_get_bool(mc->conf, CONF_ssh_subsys2)) {
        sshfwd_start_subsystem(mc->sc, true, cmd);
    } else {
        sshfwd_start_command(mc->sc, true, cmd);
    }
    mc->req_cmd_fallback = true;
}